

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

sexp sexp_bignum_shift(sexp ctx,sexp a,sexp_uint_t k)

{
  sexp_uint_t sVar1;
  sexp psVar2;
  sexp_uint_t sVar3;
  
  sVar1 = sexp_bignum_hi(a);
  psVar2 = sexp_make_bignum(ctx,k + sVar1 + 1);
  for (sVar3 = 0; sVar1 != sVar3; sVar3 = sVar3 + 1) {
    *(undefined8 *)((long)&psVar2->value + sVar3 * 8 + k * 8 + 0x10) =
         *(undefined8 *)((long)&a->value + sVar3 * 8 + 0x10);
  }
  return psVar2;
}

Assistant:

static sexp sexp_bignum_shift (sexp ctx, sexp a, sexp_uint_t k) {
  sexp res;
  sexp_uint_t alen = sexp_bignum_hi(a), i;
  res = sexp_make_bignum(ctx, alen + k + 1);
  for (i=0; i<alen; i++)
    sexp_bignum_data(res)[i+k] = sexp_bignum_data(a)[i];
  return res;
}